

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int translate_compression_level(char *value)

{
  int iVar1;
  long lVar2;
  char *in_RDI;
  
  if ((in_RDI == (char *)0x0) || (iVar1 = strcmp(in_RDI,"default"), iVar1 == 0)) {
    return -1;
  }
  iVar1 = strcmp(in_RDI,"best");
  if (iVar1 == 0) {
    return 9;
  }
  iVar1 = strcmp(in_RDI,"fastest");
  if (iVar1 == 0) {
    return 1;
  }
  iVar1 = strcmp(in_RDI,"none");
  if (iVar1 == 0) {
    return 0;
  }
  lVar2 = strtol(in_RDI,(char **)0x0,10);
  return (int)lVar2;
}

Assistant:

static int translate_compression_level(const char* value) {
   if (!value || strcmp(value, "default") == 0) {
      return Z_DEFAULT_COMPRESSION;
   }
   if (strcmp(value, "best") == 0) {
      return Z_BEST_COMPRESSION;
   }
   if (strcmp(value, "fastest") == 0) {
      return Z_BEST_SPEED;
   }
   if (strcmp(value, "none") == 0) {
      return Z_NO_COMPRESSION;
   }
   return strtol(value, NULL, 10);
}